

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O3

QTextStream * __thiscall QTextStream::operator>>(QTextStream *this,char *c)

{
  QTextStreamPrivate *pQVar1;
  QStringView QVar2;
  bool bVar3;
  char *pcVar4;
  long in_FS_OFFSET;
  qsizetype length;
  QChar *ptr;
  undefined1 *local_70;
  QChar *local_68;
  Interface *local_60;
  State local_58;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->d_ptr)._M_t.
           super___uniq_ptr_impl<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>._M_t.
           super__Tuple_impl<0UL,_QTextStreamPrivate_*,_std::default_delete<QTextStreamPrivate>_>.
           super__Head_base<0UL,_QTextStreamPrivate_*,_false>._M_head_impl;
  *c = '\0';
  if ((pQVar1->string == (QString *)0x0) && (pQVar1->device == (QIODevice *)0x0)) {
    operator>>(this);
  }
  else {
    QTextStreamPrivate::scan(pQVar1,(QChar **)0x0,(qsizetype *)0x0,0,NotSpace);
    QTextStreamPrivate::consumeLastToken(pQVar1);
    local_68 = (QChar *)&DAT_aaaaaaaaaaaaaaaa;
    local_70 = &DAT_aaaaaaaaaaaaaaaa;
    bVar3 = QTextStreamPrivate::scan(pQVar1,&local_68,(qsizetype *)&local_70,0,Space);
    if (bVar3) {
      local_60 = QStringConverter::encodingInterfaces;
      local_58.flags.super_QFlagsStorageHelper<QStringConverterBase::Flag,_4>.
      super_QFlagsStorage<QStringConverterBase::Flag>.i =
           (QFlagsStorageHelper<QStringConverterBase::Flag,_4>)0x0;
      local_58.internalState = 0;
      local_58.remainingChars = 0;
      local_58.invalidChars = 0;
      local_58.field_4.d[0] = (void *)0x0;
      local_58.field_4.d[1] = (void *)0x0;
      local_58.clearFn = (ClearDataFn)0x0;
      QVar2.m_data = &local_68->ucs;
      QVar2.m_size = (qsizetype)local_70;
      pcVar4 = (*QStringConverter::encodingInterfaces[0].fromUtf16)(c,QVar2,&local_58);
      *pcVar4 = '\0';
      QTextStreamPrivate::consumeLastToken(pQVar1);
      QStringConverterBase::State::clear(&local_58);
    }
    else {
      pQVar1 = (this->d_ptr)._M_t.
               super___uniq_ptr_impl<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>.
               _M_t.
               super__Tuple_impl<0UL,_QTextStreamPrivate_*,_std::default_delete<QTextStreamPrivate>_>
               .super__Head_base<0UL,_QTextStreamPrivate_*,_false>._M_head_impl;
      if (pQVar1->status == Ok) {
        pQVar1->status = ReadPastEnd;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QTextStream &QTextStream::operator>>(char *c)
{
    Q_D(QTextStream);
    *c = 0;
    CHECK_VALID_STREAM(*this);
    d->scan(nullptr, nullptr, 0, QTextStreamPrivate::NotSpace);
    d->consumeLastToken();

    const QChar *ptr;
    qsizetype length;
    if (!d->scan(&ptr, &length, 0, QTextStreamPrivate::Space)) {
        setStatus(ReadPastEnd);
        return *this;
    }

    QStringEncoder encoder(QStringConverter::Utf8);
    char *e = encoder.appendToBuffer(c, QStringView(ptr, length));
    *e = '\0';
    d->consumeLastToken();
    return *this;
}